

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void Persistent_Test_Hitter<8u>(string *PATH)

{
  Abstract<8U> *pAVar1;
  pointer ppbVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  Data<8U> *__ptr;
  long lVar4;
  WavingSketch<8U,_16U,_8U> *this;
  Small_Space<8U> *this_00;
  PIE<8U> *this_01;
  OO_FPI<8U> *this_02;
  ostream *poVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  int j_1;
  uint uVar8;
  ulong uVar9;
  pointer ppbVar10;
  int iVar11;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  pointer ppbVar12;
  pointer ppbVar13;
  uint32_t j;
  long lVar14;
  int cnt;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  HashMap<8U> cycle;
  HashMap<8U> mp;
  Data<8U> packet;
  Abstract<8U> *sketch [4];
  string file;
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_268;
  ofstream out;
  
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector(&outs,4,(allocator_type *)&out);
  std::__cxx11::string::string((string *)&file,"caida",(allocator *)&out);
  pbVar3 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle,
                 &RESULT_FOLDER_abi_cxx11_,"persistent_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle,&file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 "_Recall Rate (RR).csv");
  std::ofstream::ofstream(pbVar3,(string *)&out,_S_out);
  *outs.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start = pbVar3;
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&cycle);
  pbVar3 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle,
                 &RESULT_FOLDER_abi_cxx11_,"persistent_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle,&file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 "_Precision Rate (PR).csv");
  std::ofstream::ofstream(pbVar3,(string *)&out,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = pbVar3;
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&cycle);
  pbVar3 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle,
                 &RESULT_FOLDER_abi_cxx11_,"persistent_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle,&file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,"_F1.csv")
  ;
  std::ofstream::ofstream(pbVar3,(string *)&out,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[2] = pbVar3;
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&cycle);
  pbVar3 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle,
                 &RESULT_FOLDER_abi_cxx11_,"persistent_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle,&file);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mp,"_ARE.csv"
                );
  std::ofstream::ofstream(pbVar3,(string *)&out,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[3] = pbVar3;
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::~string((string *)&cycle);
  __ptr = read_standard_data<8u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
  iVar11 = 10000000;
  if (cnt < 10000000) {
    iVar11 = cnt;
  }
  lVar14 = 0;
  cnt = iVar11;
  while (lVar14 != 5) {
    lVar4 = lVar14 + 1;
    uVar8 = (int)lVar4 * 0x28;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)uVar8);
    this = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    iVar11 = (int)(lVar4 * 40000);
    WavingSketch<8U,_16U,_8U>::WavingSketch(this,iVar11,0xf3,3);
    sketch[0] = (Abstract<8U> *)this;
    this_00 = (Small_Space<8U> *)operator_new(0xb0);
    Small_Space<8U>::Small_Space(this_00,iVar11,0xf3);
    sketch[1] = (Abstract<8U> *)this_00;
    this_01 = (PIE<8U> *)operator_new(0x80);
    PIE<8U>::PIE(this_01,(int)lVar4 * 8000000,0xf3,0x640);
    sketch[2] = (Abstract<8U> *)this_01;
    this_02 = (OO_FPI<8U> *)operator_new(0x98);
    OO_FPI<8U>::OO_FPI(this_02,lVar4 * 40000,0xf3);
    ppbVar2 = outs.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sketch[3] = (Abstract<8U> *)this_02;
    ppbVar10 = outs.
               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppbVar12 = outs.
               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppbVar13 = outs.
               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (lVar14 == 0) {
      for (; ppbVar10 = outs.
                        super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
          ppbVar13 = outs.
                     super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start, ppbVar12 != ppbVar2;
          ppbVar12 = ppbVar12 + 1) {
        poVar5 = std::operator<<((ostream *)*ppbVar12,"MEM(KB)");
        std::operator<<(poVar5,",");
        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
          poVar5 = std::operator<<((ostream *)*ppbVar12,(string *)&sketch[lVar14]->name);
          std::operator<<(poVar5,",");
        }
        std::endl<char,std::char_traits<char>>((ostream *)*ppbVar12);
      }
    }
    for (; ppbVar13 != ppbVar10; ppbVar13 = ppbVar13 + 1) {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar13,uVar8);
      std::operator<<(poVar5,",");
    }
    mp._M_h._M_buckets = &mp._M_h._M_single_bucket;
    mp._M_h._M_bucket_count = 1;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    mp._M_h._M_element_count = 0;
    mp._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    mp._M_h._M_rehash_policy._M_next_resize = 0;
    mp._M_h._M_single_bucket = (__node_base_ptr)0x0;
    cycle._M_h._M_buckets = &cycle._M_h._M_single_bucket;
    cycle._M_h._M_bucket_count = 1;
    cycle._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    cycle._M_h._M_element_count = 0;
    cycle._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    cycle._M_h._M_rehash_policy._M_next_resize = 0;
    cycle._M_h._M_single_bucket = (__node_base_ptr)0x0;
    packet.str[0] = '\0';
    packet.str[1] = '\0';
    packet.str[2] = '\0';
    packet.str[3] = '\0';
    packet.str[4] = '\0';
    packet.str[5] = '\0';
    packet.str[6] = '\0';
    packet.str[7] = '\0';
    uVar9 = 0;
    uVar8 = 0;
    while (uVar9 < (uint)cnt) {
      packet.str = *&__ptr[uVar9].str;
      if ((int)((uVar9 & 0xffffffff) % 0x4c51) == 0) {
        uVar8 = uVar8 + 1;
        std::
        _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&cycle._M_h);
      }
      iVar6 = std::
              _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&mp._M_h,&packet);
      if (iVar6.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        pmVar7 = std::__detail::
                 _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&mp,&packet);
        *pmVar7 = 1;
        pmVar7 = std::__detail::
                 _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&cycle,&packet);
        *pmVar7 = 1;
      }
      else {
        iVar6 = std::
                _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&cycle._M_h,&packet);
        if (iVar6.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          pmVar7 = std::__detail::
                   _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&cycle,&packet);
          *pmVar7 = 1;
          pmVar7 = std::__detail::
                   _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&mp,&packet);
          *pmVar7 = *pmVar7 + 1;
        }
      }
      uVar9 = uVar9 + 1;
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        (*sketch[lVar14]->_vptr_Abstract[7])(sketch[lVar14],&packet,(ulong)uVar8);
      }
    }
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      pAVar1 = sketch[lVar14];
      std::
      _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_268,&mp._M_h);
      (*pAVar1->_vptr_Abstract[6])(pAVar1,&local_268,&outs);
      std::
      _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_268);
    }
    std::ofstream::ofstream(&out);
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      Abstract<8U>::print_f1(sketch[lVar14],&out,iVar11);
    }
    for (lVar14 = 0;
        ppbVar2 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppbVar10 = outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start, lVar14 != 4; lVar14 = lVar14 + 1) {
      if (sketch[lVar14] != (Abstract<8U> *)0x0) {
        (*sketch[lVar14]->_vptr_Abstract[9])();
      }
    }
    for (; ppbVar10 != ppbVar2; ppbVar10 = ppbVar10 + 1) {
      std::endl<char,std::char_traits<char>>((ostream *)*ppbVar10);
    }
    std::ofstream::~ofstream(&out);
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&cycle._M_h);
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&mp._M_h);
    lVar14 = lVar4;
  }
  free(__ptr);
  std::__cxx11::string::~string((string *)&file);
  std::
  _Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~_Vector_base(&outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 );
  return;
}

Assistant:

void Persistent_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(4);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_Recall Rate (RR).csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_Precision Rate (PR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_F1.csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "persistent_" + file + "_ARE.csv");
	int cnt;
	auto records = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	cnt = std::min(cnt, MAX_PACKET);
	for (int i = 0; i < 5; ++i) {
		constexpr int SKETCH_NUM = 4;
		int memory = Persistent_BLOCK * (i + 1);
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new WavingSketch<8, 16, DATA_LEN>(memory, Persistent_HIT);
		sketch[1] = new Small_Space<DATA_LEN>(memory, Persistent_HIT);
		sketch[2] = new PIE<DATA_LEN>(memory * 200, Persistent_HIT, 1600);
		sketch[3] = new OO_FPI<DATA_LEN>(memory, Persistent_HIT);
		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}
		HashMap<DATA_LEN> mp;
		HashMap<DATA_LEN> cycle;
		Data<DATA_LEN> packet;
		uint num = 0;
		uint time = 0;
		// int t;

		while (num < cnt) {
			packet = records[num];
			if (num % 19537 == 0) {
				time += 1;
				cycle.clear();
			}
			num++;

			if (mp.find(packet) == mp.end()) {
				mp[packet] = 1;
				cycle[packet] = 1;
			}
			else if (cycle.find(packet) == cycle.end()) {
				cycle[packet] = 1;
				mp[packet] += 1;
			}

			for (int j = 0; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(packet, time);
			}
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			sketch[j]->Check(mp, outs);
		}

		ofstream out;

		for (int j = 0; j < SKETCH_NUM; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			delete sketch[j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
	free(records);
}